

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O2

void __thiscall Fl_Group::insert(Fl_Group *this,Fl_Widget *o,int index)

{
  Fl_Group *this_00;
  Fl_Widget *pFVar1;
  uint uVar2;
  Fl_Widget **ppFVar3;
  long lVar4;
  long lVar5;
  int iStack_30;
  
  this_00 = o->parent_;
  if (this_00 != (Fl_Group *)0x0) {
    uVar2 = find(this_00,o);
    if ((this_00 == this) && (index = index - (uint)((int)uVar2 < index), index == uVar2)) {
      return;
    }
    remove(this_00,(char *)(ulong)uVar2);
  }
  o->parent_ = this;
  uVar2 = this->children_;
  if ((long)(int)uVar2 == 1) {
    pFVar1 = (Fl_Widget *)this->array_;
    ppFVar3 = (Fl_Widget **)malloc(0x10);
    this->array_ = ppFVar3;
    if (index == 0) {
      *ppFVar3 = o;
      ppFVar3[1] = pFVar1;
    }
    else {
      *ppFVar3 = pFVar1;
      ppFVar3[1] = o;
    }
    iStack_30 = 2;
  }
  else if (uVar2 == 0) {
    this->array_ = (Fl_Widget **)o;
    iStack_30 = 1;
  }
  else {
    if ((uVar2 & uVar2 - 1) == 0) {
      ppFVar3 = (Fl_Widget **)realloc(this->array_,(long)(int)uVar2 << 4);
      this->array_ = ppFVar3;
      uVar2 = this->children_;
    }
    lVar5 = (long)(int)uVar2;
    lVar4 = lVar5 << 0x20;
    for (; ppFVar3 = this->array_, index < lVar5; lVar5 = lVar5 + -1) {
      ppFVar3[lVar5] = ppFVar3[lVar5 + -1];
      lVar4 = lVar4 + -0x100000000;
    }
    *(Fl_Widget **)((long)ppFVar3 + (lVar4 >> 0x1d)) = o;
    iStack_30 = uVar2 + 1;
  }
  this->children_ = iStack_30;
  init_sizes(this);
  return;
}

Assistant:

void Fl_Group::insert(Fl_Widget &o, int index) {
  if (o.parent()) {
    Fl_Group* g = o.parent();
    int n = g->find(o);
    if (g == this) {
      if (index > n) index--;
      if (index == n) return;
    }
    g->remove(n);
  }
  o.parent_ = this;
  if (children_ == 0) { // use array pointer to point at single child
    array_ = (Fl_Widget**)&o;
  } else if (children_ == 1) { // go from 1 to 2 children
    Fl_Widget* t = (Fl_Widget*)array_;
    array_ = (Fl_Widget**)malloc(2*sizeof(Fl_Widget*));
    if (index) {array_[0] = t; array_[1] = &o;}
    else {array_[0] = &o; array_[1] = t;}
  } else {
    if (!(children_ & (children_-1))) // double number of children
      array_ = (Fl_Widget**)realloc((void*)array_,
				    2*children_*sizeof(Fl_Widget*));
    int j; for (j = children_; j > index; j--) array_[j] = array_[j-1];
    array_[j] = &o;
  }
  children_++;
  init_sizes();
}